

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_internal.c
# Opt level: O2

void stretch_image(uint32_t *srcImage,uint32_t srcX,uint32_t srcY,uint32_t srcWidth,
                  uint32_t srcHeight,uint32_t srcPitch,uint32_t *dstImage,uint32_t dstX,
                  uint32_t dstY,uint32_t dstWidth,uint32_t dstHeight,uint32_t dstPitch)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (dstImage != (uint32_t *)0x0 && srcImage != (uint32_t *)0x0) {
    puVar4 = srcImage + (srcY * srcPitch + srcX);
    puVar5 = dstImage + (dstY * dstPitch + dstX);
    uVar3 = 0;
    for (uVar2 = 0; uVar2 != dstHeight; uVar2 = uVar2 + 1) {
      uVar7 = 0;
      for (uVar6 = 0; dstWidth != uVar6; uVar6 = uVar6 + 1) {
        puVar5[uVar6] = puVar4[uVar7 >> 0x10];
        uVar7 = (ulong)((int)uVar7 + (srcWidth << 0x10) / dstWidth);
      }
      uVar3 = uVar3 + (srcHeight << 0x10) / dstHeight;
      uVar1 = (uVar3 >> 0x10) * srcPitch;
      if (uVar3 < 0x10000) {
        uVar1 = 0;
      }
      uVar3 = uVar3 & 0xffff;
      puVar4 = puVar4 + uVar1;
      puVar5 = puVar5 + dstPitch;
    }
  }
  return;
}

Assistant:

void 
stretch_image(uint32_t *srcImage, uint32_t srcX, uint32_t srcY, uint32_t srcWidth, uint32_t srcHeight, uint32_t srcPitch,
              uint32_t *dstImage, uint32_t dstX, uint32_t dstY, uint32_t dstWidth, uint32_t dstHeight, uint32_t dstPitch) {

    uint32_t    x, y;
    uint32_t    srcOffsetX, srcOffsetY;

    if(srcImage == 0x0 || dstImage == 0x0)
        return;

    srcImage += srcX + srcY * srcPitch;
    dstImage += dstX + dstY * dstPitch;

    const uint32_t deltaX = (srcWidth  << 16) / dstWidth;
    const uint32_t deltaY = (srcHeight << 16) / dstHeight;

    srcOffsetY = 0;
    for(y=0; y<dstHeight; ++y) {
        srcOffsetX = 0;
        for(x=0; x<dstWidth; ++x) {
#if defined(kUseBilinearInterpolation)
            dstImage[x] = interpolate(srcImage, x+srcX, y+srcY, srcOffsetX, srcOffsetY, srcWidth, srcHeight, srcPitch);
#else
            dstImage[x] = srcImage[srcOffsetX >> 16];
#endif
            srcOffsetX += deltaX;
        }

        srcOffsetY += deltaY;
        if(srcOffsetY >= 0x10000) {
            srcImage += (srcOffsetY >> 16) * srcPitch;
            srcOffsetY &= 0xffff;
        }
        dstImage += dstPitch;
    }
}